

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

idx_t duckdb::GetRowGroupOffset(ParquetReader *reader,idx_t group_idx)

{
  _Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false> _Var1;
  ParquetFileMetadataCache *pPVar2;
  const_reference pvVar3;
  size_type __n;
  idx_t iVar4;
  
  pPVar2 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(&reader->metadata);
  if (group_idx == 0) {
    iVar4 = 0;
  }
  else {
    _Var1._M_head_impl =
         (pPVar2->metadata).
         super_unique_ptr<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
         ._M_t.
         super___uniq_ptr_impl<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_duckdb_parquet::FileMetaData_*,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
         .super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl;
    __n = 0;
    iVar4 = 0;
    do {
      pvVar3 = vector<duckdb_parquet::RowGroup,_true>::operator[]
                         (&(_Var1._M_head_impl)->row_groups,__n);
      iVar4 = iVar4 + pvVar3->num_rows;
      __n = __n + 1;
    } while (group_idx != __n);
  }
  return iVar4;
}

Assistant:

idx_t GetRowGroupOffset(ParquetReader &reader, idx_t group_idx) {
	idx_t row_group_offset = 0;
	auto &row_groups = reader.GetFileMetadata()->row_groups;
	for (idx_t i = 0; i < group_idx; i++) {
		row_group_offset += row_groups[i].num_rows;
	}
	return row_group_offset;
}